

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hamt_map_types.hpp
# Opt level: O0

pair<const_pstore::index::details::index_pointer,_unsigned_long> __thiscall
pstore::index::details::linear_node::
lookup<pstore::uint128,pstore::uint128,std::equal_to<pstore::uint128>,void>
          (linear_node *this,uint128 *db,size_t key)

{
  bool bVar1;
  const_iterator paVar2;
  database_reader *archive;
  serialize *this_00;
  index_pointer local_a8;
  value_type local_a0;
  index_pointer local_98;
  value_type local_90;
  database_reader local_88;
  uint128 *local_78;
  uint128 existing_key;
  address *child;
  const_iterator __end3;
  const_iterator __begin3;
  linear_node *__range3;
  size_t cnum;
  uint128 *key_local;
  database *db_local;
  linear_node *this_local;
  pair<const_pstore::index::details::index_pointer,_unsigned_long> local_18;
  
  __range3 = (linear_node *)0x0;
  cnum = key;
  key_local = db;
  db_local = (database *)this;
  __end3 = begin(this);
  paVar2 = end(this);
  while( true ) {
    if (__end3 == paVar2) {
      index_pointer::index_pointer((index_pointer *)&local_a8.addr_);
      std::pair<const_pstore::index::details::index_pointer,_unsigned_long>::
      pair<pstore::index::details::index_pointer,_true>(&local_18,&local_a8,&not_found);
      return local_18;
    }
    local_90 = __end3->a_;
    this_00 = (serialize *)key_local;
    serialize::archive::database_reader::database_reader
              (&local_88,(database *)key_local,(address)local_90);
    local_78 = serialize::read<pstore::uint128,pstore::serialize::archive::database_reader>
                         ((uint128 *)&local_88,this_00,archive);
    bVar1 = std::equal_to<pstore::uint128>::operator()
                      ((equal_to<pstore::uint128> *)((long)&this_local + 7),(uint128 *)&local_78,
                       (uint128 *)cnum);
    if (bVar1) break;
    __range3 = (linear_node *)((__range3->signature_)._M_elems + 1);
    __end3 = __end3 + 1;
  }
  local_a0 = __end3->a_;
  index_pointer::index_pointer((index_pointer *)&local_98.addr_,(address)local_a0);
  std::pair<const_pstore::index::details::index_pointer,_unsigned_long>::
  pair<pstore::index::details::index_pointer,_unsigned_long_&,_true>
            (&local_18,&local_98,(unsigned_long *)&__range3);
  return local_18;
}

Assistant:

auto linear_node::lookup (database const & db, OtherKeyType const & key,
                                      KeyEqual equal) const
                -> std::pair<index_pointer const, std::size_t> {
                // Linear search. TODO: perhaps we should sort the nodes and use a binary
                // search? This would require a template compare method.
                std::size_t cnum = 0;
                for (auto const & child : *this) {
                    KeyType const existing_key =
                        serialize::read<KeyType> (serialize::archive::database_reader{db, child});
                    if (equal (existing_key, key)) {
                        return {index_pointer{child}, cnum};
                    }
                    ++cnum;
                }
                // Not found
                return {index_pointer (), details::not_found};
            }